

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

bov_window_t * bov_window_new(int width,int height,char *win_name)

{
  byte bVar1;
  PFNGLUNIFORM1IPROC p_Var2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLuint GVar8;
  GLint GVar9;
  bov_window_t *window;
  GLFWmonitor *pGVar10;
  GLFWvidmode *pGVar11;
  GLFWwindow *handle;
  GLFWcursor *pGVar12;
  void *__ptr;
  undefined1 *puVar13;
  bov_text_t *pbVar14;
  long lVar15;
  uchar (*pauVar16) [640];
  uchar *puVar17;
  undefined8 uVar18;
  long lVar19;
  char *pcVar20;
  bov_space_type_t bVar21;
  long lVar22;
  undefined1 *puVar23;
  GLenum shaderType;
  int iVar24;
  uint uVar25;
  double dVar26;
  double dVar27;
  int height_local;
  GLuint local_1d0;
  GLuint local_1cc;
  GLuint local_1c8;
  GLuint local_1c4;
  GLuint local_1c0;
  GLuint local_1bc;
  int width_local;
  GLuint local_1b4;
  double cursorY;
  double cursorX;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  GLuint local_16c;
  GLchar *local_168;
  GLchar *local_160;
  GLchar *local_158;
  GLchar *local_150;
  GLchar *local_148;
  GLchar *local_140;
  GLchar *local_138;
  GLchar *local_130;
  GLchar *local_128;
  GLchar *local_120;
  GLubyte local_118 [37];
  GLubyte local_f3 [195];
  
  height_local = height;
  width_local = width;
  window = (bov_window_t *)malloc(0xc0);
  if (window == (bov_window_t *)0x0) {
    bov_error_log(0x30001,"Memory allocation failed");
    pcVar20 = "bov_window_new";
    uVar18 = 0x2ed;
  }
  else {
    glfwSetErrorCallback(error_callback);
    iVar3 = glfwInit();
    if (iVar3 == 0) goto LAB_0011ed6a;
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x2100d,0);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    if (width == 0 || height == 0) {
      pGVar10 = glfwGetPrimaryMonitor();
      pGVar11 = glfwGetVideoMode(pGVar10);
      window->size[0] = pGVar11->width;
      height = pGVar11->height;
      window->size[1] = height;
      width = pGVar11->width;
      pGVar10 = glfwGetPrimaryMonitor();
    }
    else {
      if (height < 0) {
        glfwWindowHint(0x20003,0);
        height = -height;
        height_local = height;
      }
      if (width < 0) {
        glfwWindowHint(0x20008,1);
        width = 100;
        height = width;
        height_local = width;
        width_local = width;
      }
      window->size[0] = width;
      window->size[1] = height;
      pGVar10 = (GLFWmonitor *)0x0;
    }
    handle = glfwCreateWindow(width,height,win_name,pGVar10,(GLFWwindow *)0x0);
    window->self = handle;
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_0011ed6a;
    }
    glfwMakeContextCurrent(handle);
    glfwSetWindowUserPointer(window->self,window);
    iVar3 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar3 == 0) {
      bov_error_log(0x20004,"Failed to initialize OpenGL context");
      fprintf(_stderr,"\t(in function %s, line %d)\n","bov_window_new",800);
    }
    (window->param).zoom = 1.0;
    glfwGetFramebufferSize(window->self,&width_local,&height_local);
    framebuffer_size_callback(window->self,width_local,height_local);
    (window->param).translate[0] = 0.0;
    (window->param).translate[1] = 0.0;
    window->wtime = 2.2250738585072014e-308;
    window->backgroundColor[0] = 1.0;
    window->backgroundColor[1] = 1.0;
    window->backgroundColor[2] = 1.0;
    window->backgroundColor[3] = 0.0;
    glfwSetKeyCallback(window->self,key_callback);
    glfwSetFramebufferSizeCallback(window->self,framebuffer_size_callback);
    glfwSetWindowSizeCallback(window->self,window_size_callback);
    glfwSetMouseButtonCallback(window->self,mouse_button_callback);
    glfwSetCursorPosCallback(window->self,cursor_pos_callback);
    glfwSetScrollCallback(window->self,scroll_callback);
    glfwSwapInterval(1);
    (*glad_glClearColor)
              (window->backgroundColor[0],window->backgroundColor[1],window->backgroundColor[2],
               window->backgroundColor[3]);
    (*glad_glEnable)(0x809d);
    (*glad_glEnable)(0xb44);
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(0x302,0x303);
    (*glad_glPointSize)(5.0);
    (*glad_glEnable)(0xb20);
    glfwSetTime(2.2250738585072014e-308);
    cursorX = 0.0;
    cursorY = 0.0;
    glfwGetCursorPos(window->self,&cursorX,&cursorY);
    window->cursorPos[0] = (cursorX + cursorX) / (double)window->size[0] + -1.0;
    dVar26 = 1.0 - cursorY / (double)window->size[1];
    window->cursorPos[1] = dVar26 + dVar26 + -1.0;
    window->clickTime[0] = 0.0;
    window->clickTime[1] = 0.0;
    window->counter = 0;
    window->running = 1;
    window->help_needed = 0;
    window->indication_needed = 0;
    pGVar12 = glfwCreateStandardCursor(0x36005);
    window->leftClickCursor = pGVar12;
    (*glad_glGenBuffers)(2,window->ubo);
    (*glad_glBindBuffer)(0x8a11,window->ubo[0]);
    (*glad_glBufferData)(0x8a11,0x14,(void *)0x0,0x88e4);
    (*glad_glBindBufferRange)(0x8a11,0,window->ubo[0],0,0x14);
    (*glad_glBindBuffer)(0x8a11,window->ubo[1]);
    shaderType = 0x40;
    (*glad_glBufferData)(0x8a11,0x40,(void *)0x0,0x88e8);
    (*glad_glBindBufferRange)(0x8a11,1,window->ubo[1],0,0x40);
    (*glad_glBindBuffer)(0x8a11,0);
    cursorX = (double)text_vert;
    local_170 = 0xa42;
    GVar4 = LoadShader((GLsizei)&cursorX,(GLchar **)&local_170,(GLint *)"text_vert.glsl",
                       (char *)0x8b31,shaderType);
    if (GVar4 != 0) {
      cursorY = (double)text_frag;
      local_174 = 0xa1c;
      GVar5 = LoadShader((GLsizei)&cursorY,(GLchar **)&local_174,(GLint *)"text_frag.glsl",
                         (char *)0x8b30,shaderType);
      if (GVar5 != 0) {
        GVar6 = (*glad_glCreateProgram)();
        window->program[0] = GVar6;
        (*glad_glBindAttribLocation)(GVar6,0,"pos");
        (*glad_glBindAttribLocation)(window->program[0],1,"tex");
        GVar6 = GVar5;
        iVar3 = program_init(window,0,2,(ulong)GVar4);
        if (iVar3 == 0) {
          (*glad_glDetachShader)(window->program[0],GVar4);
          (*glad_glDetachShader)(window->program[0],GVar5);
          (*glad_glDeleteShader)(GVar4);
          (*glad_glDeleteShader)(GVar5);
          local_120 = points_vert;
          local_178 = 0x51;
          GVar4 = LoadShader((GLsizei)&local_120,(GLchar **)&local_178,(GLint *)"points_vert.glsl",
                             (char *)0x8b31,GVar6);
          if (GVar4 != 0) {
            local_128 = points_geom;
            local_17c = 0xd11;
            GVar5 = LoadShader((GLsizei)&local_128,(GLchar **)&local_17c,(GLint *)"points_geom.glsl"
                               ,(char *)0x8dd9,GVar6);
            if (GVar5 != 0) {
              local_130 = lines_geom;
              local_180 = 0xd7f;
              local_1bc = LoadShader((GLsizei)&local_130,(GLchar **)&local_180,
                                     (GLint *)"lines_geom.glsl",(char *)0x8dd9,GVar6);
              if (local_1bc != 0) {
                local_138 = curve_geom;
                local_184 = 0x1672;
                local_1c4 = LoadShader((GLsizei)&local_138,(GLchar **)&local_184,
                                       (GLint *)"curve_geom.glsl",(char *)0x8dd9,GVar6);
                if (local_1c4 != 0) {
                  local_140 = triangles_geom;
                  local_188 = 0xf87;
                  local_1c8 = LoadShader((GLsizei)&local_140,(GLchar **)&local_188,
                                         (GLint *)"triangles_geom.glsl",(char *)0x8dd9,GVar6);
                  if (local_1c8 != 0) {
                    local_148 = points_frag;
                    local_18c = 0x101d;
                    local_1c0 = LoadShader((GLsizei)&local_148,(GLchar **)&local_18c,
                                           (GLint *)"points_frag.glsl",(char *)0x8b30,GVar6);
                    if (local_1c0 != 0) {
                      local_150 = lines_frag;
                      local_190 = 0x7ff;
                      GVar7 = LoadShader((GLsizei)&local_150,(GLchar **)&local_190,
                                         (GLint *)"lines_frag.glsl",(char *)0x8b30,GVar6);
                      if (GVar7 != 0) {
                        local_158 = triangles_frag;
                        local_194 = 0x74c;
                        local_1cc = LoadShader((GLsizei)&local_158,(GLchar **)&local_194,
                                               (GLint *)"triangles_frag.glsl",(char *)0x8b30,GVar6);
                        if (local_1cc != 0) {
                          local_160 = default_vert;
                          local_198 = 0x8cf;
                          local_1d0 = LoadShader((GLsizei)&local_160,(GLchar **)&local_198,
                                                 (GLint *)"default_vert.glsl",(char *)0x8b31,GVar6);
                          if (local_1d0 != 0) {
                            local_168 = default_frag;
                            local_19c = 0x646;
                            GVar6 = LoadShader((GLsizei)&local_168,(GLchar **)&local_19c,
                                               (GLint *)"default_frag.glsl",(char *)0x8b30,GVar6);
                            if (GVar6 != 0) {
                              GVar8 = (*glad_glCreateProgram)();
                              window->program[1] = GVar8;
                              GVar8 = (*glad_glCreateProgram)();
                              window->program[2] = GVar8;
                              GVar8 = (*glad_glCreateProgram)();
                              window->program[3] = GVar8;
                              GVar8 = (*glad_glCreateProgram)();
                              window->program[4] = GVar8;
                              GVar8 = (*glad_glCreateProgram)();
                              window->program[5] = GVar8;
                              local_1b4 = GVar4;
                              (*glad_glBindAttribLocation)(window->program[1],0,"pos");
                              (*glad_glBindAttribLocation)(window->program[2],0,"pos");
                              (*glad_glBindAttribLocation)(window->program[3],0,"pos");
                              (*glad_glBindAttribLocation)(window->program[4],0,"pos");
                              (*glad_glBindAttribLocation)(window->program[5],0,"pos");
                              GVar4 = local_1b4;
                              iVar3 = program_init(window,1,3,(ulong)local_1b4,(ulong)GVar5,
                                                   (ulong)local_1c0);
                              if (iVar3 == 0) {
                                (*glad_glDetachShader)(window->program[1],GVar4);
                                (*glad_glDetachShader)(window->program[1],GVar5);
                                GVar8 = local_1c0;
                                (*glad_glDetachShader)(window->program[1],local_1c0);
                                (*glad_glDeleteShader)(GVar5);
                                (*glad_glDeleteShader)(GVar8);
                                iVar3 = program_init(window,2,3,(ulong)GVar4,(ulong)local_1bc,
                                                     (ulong)GVar7);
                                if (iVar3 == 0) {
                                  (*glad_glDetachShader)(window->program[2],GVar4);
                                  GVar5 = local_1bc;
                                  (*glad_glDetachShader)(window->program[2],local_1bc);
                                  (*glad_glDetachShader)(window->program[2],GVar7);
                                  (*glad_glDeleteShader)(GVar5);
                                  iVar3 = program_init(window,3,3,(ulong)GVar4,(ulong)local_1c4,
                                                       (ulong)GVar7);
                                  if (iVar3 == 0) {
                                    (*glad_glDetachShader)(window->program[3],GVar4);
                                    GVar5 = local_1c4;
                                    (*glad_glDetachShader)(window->program[3],local_1c4);
                                    (*glad_glDetachShader)(window->program[3],GVar7);
                                    (*glad_glDeleteShader)(GVar5);
                                    (*glad_glDeleteShader)(GVar7);
                                    iVar3 = program_init(window,4,3,(ulong)GVar4,(ulong)local_1c8);
                                    if (iVar3 == 0) {
                                      (*glad_glDetachShader)(window->program[4],GVar4);
                                      GVar7 = local_1c8;
                                      (*glad_glDetachShader)(window->program[4],local_1c8);
                                      GVar5 = local_1cc;
                                      (*glad_glDetachShader)(window->program[4],local_1cc);
                                      (*glad_glDeleteShader)(GVar4);
                                      (*glad_glDeleteShader)(GVar7);
                                      (*glad_glDeleteShader)(GVar5);
                                      iVar3 = program_init(window,5,2,(ulong)local_1d0,(ulong)GVar6)
                                      ;
                                      GVar4 = local_1d0;
                                      if (iVar3 == 0) {
                                        (*glad_glDetachShader)(window->program[5],local_1d0);
                                        (*glad_glDetachShader)(window->program[5],GVar6);
                                        (*glad_glDeleteShader)(GVar4);
                                        (*glad_glDeleteShader)(GVar6);
                                        __ptr = malloc(0x12c000);
                                        if (__ptr != (void *)0x0) {
                                          puVar13 = (undefined1 *)((long)__ptr + 0x785);
                                          lVar15 = 1;
                                          lVar19 = 0x134c6a;
                                          while (lVar15 != 0x27f) {
                                            lVar15 = lVar15 + 1;
                                            puVar23 = puVar13;
                                            for (lVar22 = -0x27e; lVar22 != 0; lVar22 = lVar22 + 1)
                                            {
                                              bVar1 = *(byte *)(lVar19 + 0x27c + lVar22);
                                              iVar24 = (uint)*(byte *)(lVar19 + -0x284 + lVar22) -
                                                       (uint)*(byte *)(lVar19 + 0x27e + lVar22);
                                              uVar25 = (uint)*(byte *)(lVar19 + -0x282 + lVar22);
                                              iVar3 = ((bVar1 - uVar25) + iVar24) * 0x2f +
                                                      ((uint)*(byte *)(lVar19 + -4 + lVar22) -
                                                      (uint)*(byte *)(lVar19 + -2 + lVar22)) * 0xa2;
                                              iVar24 = ((uVar25 - bVar1) + iVar24) * 0x2f +
                                                       ((uint)*(byte *)(lVar19 + -0x283 + lVar22) -
                                                       (uint)*(byte *)(lVar19 + 0x27d + lVar22)) *
                                                       0xa2;
                                              dVar27 = SQRT((double)(iVar24 * iVar24 + iVar3 * iVar3
                                                                    ));
                                              dVar26 = ((double)iVar3 / dVar27) * 128.0 + 128.0;
                                              if (dVar26 <= 0.0) {
                                                dVar26 = 0.0;
                                              }
                                              if (255.9 <= dVar26) {
                                                dVar26 = 255.9;
                                              }
                                              puVar23[-2] = *(undefined1 *)(lVar19 + -3 + lVar22);
                                              dVar27 = ((double)iVar24 / dVar27) * 128.0 + 128.0;
                                              if (dVar27 <= 0.0) {
                                                dVar27 = 0.0;
                                              }
                                              if (255.9 <= dVar27) {
                                                dVar27 = 255.9;
                                              }
                                              puVar23[-1] = (char)(int)dVar26;
                                              *puVar23 = (char)(int)dVar27;
                                              puVar23 = puVar23 + 3;
                                            }
                                            puVar13 = puVar13 + 0x780;
                                            lVar19 = lVar19 + 0x280;
                                          }
                                          pauVar16 = font.tex_data;
                                          for (lVar15 = 2; lVar15 != 0x12c002;
                                              lVar15 = lVar15 + 0x780) {
                                            *(uchar *)((long)__ptr + lVar15 + -2) = (*pauVar16)[0];
                                            *(undefined2 *)((long)__ptr + lVar15 + -1) = 0;
                                            pauVar16 = pauVar16 + 1;
                                          }
                                          puVar17 = font.tex_data[0] + 0x27f;
                                          for (lVar15 = 0x77f; lVar15 != 0x12c77f;
                                              lVar15 = lVar15 + 0x780) {
                                            *(uchar *)((long)__ptr + lVar15 + -2) = *puVar17;
                                            *(undefined2 *)((long)__ptr + lVar15 + -1) = 0;
                                            puVar17 = puVar17 + 0x280;
                                          }
                                          puVar17 = font.tex_data[0];
                                          for (lVar15 = 5; puVar17 = puVar17 + 1, lVar15 != 0x77f;
                                              lVar15 = lVar15 + 3) {
                                            *(uchar *)((long)__ptr + lVar15 + -2) = *puVar17;
                                            *(undefined2 *)((long)__ptr + lVar15 + -1) = 0;
                                          }
                                          puVar17 = font.tex_data[0x27f];
                                          for (lVar15 = 0x12b885; puVar17 = puVar17 + 1,
                                              lVar15 != 0x12bfff; lVar15 = lVar15 + 3) {
                                            *(uchar *)((long)__ptr + lVar15 + -2) = *puVar17;
                                            *(undefined2 *)((long)__ptr + lVar15 + -1) = 0;
                                          }
                                          (*glad_glActiveTexture)(0x84c0);
                                          (*glad_glGenTextures)(1,&local_16c);
                                          (*glad_glBindTexture)(0xde1,local_16c);
                                          (*glad_glTexImage2D)
                                                    (0xde1,0,0x1907,0x280,0x280,0,0x1907,0x1401,
                                                     __ptr);
                                          (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
                                          (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
                                          (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
                                          (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
                                          window->font_atlas_texture = local_16c;
                                          free(__ptr);
                                          GVar4 = window->program[0];
                                          (*glad_glUseProgram)(GVar4);
                                          GVar5 = (*glad_glGetUniformBlockIndex)(GVar4,"worldBlock")
                                          ;
                                          GVar6 = (*glad_glGetUniformBlockIndex)
                                                            (GVar4,"objectBlock");
                                          (*glad_glUniformBlockBinding)(GVar4,GVar5,0);
                                          (*glad_glUniformBlockBinding)(GVar4,GVar6,1);
                                          p_Var2 = glad_glUniform1i;
                                          GVar9 = (*glad_glGetUniformLocation)(GVar4,"fontTex");
                                          (*p_Var2)(GVar9,0);
                                          points_rasterizer_init(window->program[1]);
                                          points_rasterizer_init(window->program[3]);
                                          points_rasterizer_init(window->program[4]);
                                          points_rasterizer_init(window->program[2]);
                                          points_rasterizer_init(window->program[5]);
                                          window->last_program = 5;
                                          memcpy(local_f3,
                                                 " Keyboard shortcuts:\n -------------------\n\n   [esc]   exit\n  [space]  play/pause\n     p     save .ppm screenshot\n     r     reset zoom and translation\n    h k    display/hide keyboard shortcuts\n"
                                                 ,0xc3);
                                          bVar21 = 0x88e4;
                                          pbVar14 = bov_text_new(local_f3,0x88e4);
                                          window->help = pbVar14;
                                          bov_text_set_space_type(pbVar14,bVar21);
                                          pbVar14 = window->help;
                                          (pbVar14->param).pos[0] = 16.0;
                                          (pbVar14->param).pos[1] = 288.0;
                                          (pbVar14->param).fontSize = 32.0;
                                          (pbVar14->param).boldness = 0.1;
                                          (pbVar14->param).outlineWidth = 0.5;
                                          builtin_memcpy(local_118,
                                                         "press \'k\' for keyboard shortcuts\n",0x22
                                                        );
                                          bVar21 = 0x88e4;
                                          pbVar14 = bov_text_new(local_118,0x88e4);
                                          window->indication = pbVar14;
                                          bov_text_set_space_type(pbVar14,bVar21);
                                          pbVar14 = window->indication;
                                          (pbVar14->param).pos[0] = 16.0;
                                          (pbVar14->param).pos[1] = 16.0;
                                          (pbVar14->param).fontSize = 32.0;
                                          (pbVar14->param).boldness = 0.1;
                                          (pbVar14->param).outlineWidth = 0.5;
                                          return window;
                                        }
                                        bov_error_log(0x30001,"Memory allocation failed");
                                        pcVar20 = "text_rasterizer_init";
                                        uVar18 = 0xf8;
                                        goto LAB_0011ed63;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bov_error_log(0x20002,"check your driver and OpenGL capabilities");
    pcVar20 = "window_OpenGL_init";
    uVar18 = 0x2e5;
  }
LAB_0011ed63:
  fprintf(_stderr,"\t(in function %s, line %d)\n",pcVar20,uVar18);
LAB_0011ed6a:
  exit(1);
}

Assistant:

bov_window_t* bov_window_new(int width, int height, const char* win_name)
{
	bov_window_t* window = malloc(sizeof(bov_window_t));
	CHECK_MALLOC(window);

	glfwSetErrorCallback(error_callback);

	if(!glfwInit())
		exit(EXIT_FAILURE);

	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
	glfwWindowHint(GLFW_SAMPLES, 0); // we disable multisampling has we already use shader antialiasing
	glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	if(width==0 || height==0) {
		const GLFWvidmode* mode = glfwGetVideoMode(glfwGetPrimaryMonitor());
		window->size[0] = mode->width;
		window->size[1] = mode->height;
		window->self = glfwCreateWindow(mode->width, mode->height, win_name,
		                                glfwGetPrimaryMonitor(), // fullscreen
		                                NULL);
	}
	else {
		if(height<0) {
			glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
			height = -height;
		}

		if(width<0) {
			glfwWindowHint(GLFW_MAXIMIZED, GLFW_TRUE);
			width = 100;
			height = 100;
		}
		window->size[0] = width;


		window->size[1] = height;

		window->self = glfwCreateWindow(width, height, win_name, NULL, NULL);
	}

	if(!window->self) {
		glfwTerminate();
		exit(EXIT_FAILURE);
	}

	glfwMakeContextCurrent(window->self);
	glfwSetWindowUserPointer(window->self,window);

	// load opengl functions with GLAD
	if(!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress))
		BOV_ERROR_LOG(BOV_GLAD_ERROR,
		              "Failed to initialize OpenGL context");

	window->param.zoom = 1.0;
	glfwGetFramebufferSize(window->self, &width, &height);
	framebuffer_size_callback(window->self, width, height);
	window->param.translate[0] = window->param.translate[1] = 0.0;
	window->wtime = DBL_MIN;

	// white background color
	window->backgroundColor[0] = 1.0;
	window->backgroundColor[1] = 1.0;
	window->backgroundColor[2] = 1.0;
	window->backgroundColor[3] = 0.0;

	// glfwSetWindowCloseCallback(window->self,close_callback);
	glfwSetKeyCallback(window->self, key_callback);
	glfwSetFramebufferSizeCallback(window->self, framebuffer_size_callback);
	glfwSetWindowSizeCallback(window->self, window_size_callback);
	glfwSetMouseButtonCallback(window->self, mouse_button_callback);
	glfwSetCursorPosCallback(window->self, cursor_pos_callback);
	glfwSetScrollCallback(window->self, scroll_callback);

	//glfwSetInputMode(window->self,GLFW_CURSOR,GLFW_CURSOR_HIDDEN);


	glfwSwapInterval(1); // vsync
	glClearColor(window->backgroundColor[0],
	             window->backgroundColor[1],
	             window->backgroundColor[2],
	             window->backgroundColor[3]);
	glEnable(GL_MULTISAMPLE);
	glEnable(GL_CULL_FACE); // cull face that are not counterclockwise
	glEnable( GL_BLEND );
	glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

	glPointSize(5); // 10 pixels for a point
	glEnable( GL_LINE_SMOOTH );

	glfwSetTime(DBL_MIN); // set the time to 0

	{
		double cursorX = 0.0, cursorY = 0.0;
		glfwGetCursorPos(window->self, &cursorX, &cursorY);
		window->cursorPos[0] = 2.0 * cursorX / window->size[0] - 1.0;
		window->cursorPos[1] = 2.0 * (1.0 - cursorY / window->size[1]) - 1.0;
		window->clickTime[0] = 0.0;
		window->clickTime[1] = 0.0;
	}

	window->counter = 0;
	window->running = 1;
	window->help_needed = 0;
	window->indication_needed = 0;
	window->leftClickCursor = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);

	window_OpenGL_init(window);

	window->help = bov_text_new((GLubyte[]) {
		" Keyboard shortcuts:\n"
		" -------------------\n\n"
		"   [esc]   exit\n"
		"  [space]  play/pause\n"
		"     p     save .ppm screenshot\n"
		"     r     reset zoom and translation\n"
		"    h k    display/hide keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->help, PIXEL_SPACE);
	bov_text_set_fontsize(window->help, 32.0f); // 32 pixel height
	bov_text_set_pos(window->help, (GLfloat[2]){16.0f, 7.0f * 32.0f + 64.0f});
	bov_text_set_boldness(window->help, 0.1f);
	bov_text_set_outline_width(window->help, 0.5f);

	window->indication = bov_text_new((GLubyte[]) {
		"press 'k' for keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->indication, PIXEL_SPACE);
	bov_text_set_fontsize(window->indication, 32.0f); // 32 pixel height
	bov_text_set_pos(window->indication, (GLfloat[2]){16.0f, 16.0f});
	bov_text_set_boldness(window->indication, 0.1f);
	bov_text_set_outline_width(window->indication, 0.5f);

	return window;
}